

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

DistributionMapping __thiscall
amrex::DistributionMapping::makeSFC
          (DistributionMapping *this,LayoutData<double> *rcost_local,Real *currentEfficiency,
          Real *proposedEfficiency,bool broadcastToAll,int root)

{
  double *pdVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  double *pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  DistributionMapping DVar11;
  Vector<double,_std::allocator<double>_> rcost;
  Vector<long,_std::allocator<long>_> cost;
  allocator_type local_69;
  vector<double,_std::allocator<double>_> local_68;
  vector<long,_std::allocator<long>_> local_50;
  Real *local_38;
  
  local_38 = currentEfficiency;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,
             (long)((int)((ulong)((*(long **)(rcost_local + 0x50))[1] -
                                 **(long **)(rcost_local + 0x50)) >> 2) * -0x49249249),
             (allocator_type *)&local_50);
  ParallelDescriptor::GatherLayoutDataToVector<double>
            (rcost_local,(Vector<double,_std::allocator<double>_> *)&local_68,root);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0080c860;
  p_Var2[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[5]._M_use_count = 0;
  p_Var2[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[2]._M_use_count = 0;
  p_Var2[2]._M_weak_count = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[3]._M_weak_count = 0;
  *(undefined8 *)&p_Var2[3]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var2[4]._vptr__Sp_counted_base + 4) = 0;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var2 + 1);
  _Var5._M_pi = extraout_RDX;
  if (*(int *)(ParallelContext::frames + 0xc) == root) {
    std::vector<long,_std::allocator<long>_>::vector
              (&local_50,
               (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_69);
    pdVar6 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    pdVar4 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar6 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      dVar9 = *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar10 = *pdVar6;
        pdVar1 = pdVar6;
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
          pdVar1 = pdVar4;
        }
        pdVar4 = pdVar1;
        pdVar6 = pdVar6 + 1;
        dVar9 = dVar10;
      } while (pdVar6 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    lVar3 = (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (0 < lVar3) {
      dVar9 = *pdVar4;
      uVar8 = -(ulong)(dVar9 == 0.0);
      lVar7 = 0;
      do {
        local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar7] =
             (long)(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7] *
                   (double)(uVar8 & 0x41cdcd6500000000 | ~uVar8 & (ulong)(1000000000.0 / dVar9))) +
             1;
        lVar7 = lVar7 + 1;
      } while (lVar3 != lVar7);
    }
    SFCProcessorMap(this,(BoxArray *)(rcost_local + 8),&local_50,
                    *(int *)(ParallelContext::frames + 0x10),proposedEfficiency,false);
    ComputeDistributionMappingEfficiency
              ((DistributionMapping *)(rcost_local + 0x70),
               (Vector<double,_std::allocator<double>_> *)&local_68,local_38);
    _Var5._M_pi = extraout_RDX_00;
    if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var5._M_pi = extraout_RDX_01;
    }
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var5._M_pi = extraout_RDX_02;
  }
  DVar11.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  DVar11.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (DistributionMapping)
         DVar11.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const LayoutData<Real>& rcost_local,
                              Real& currentEfficiency, Real& proposedEfficiency,
                              bool broadcastToAll, int root)
{
    BL_PROFILE("makeSFC");

    // Proposed distribution mapping is computed from global vector of costs on root;
    // required information is gathered on root from the layoutData information
    //
    // Two main steps:
    // 1. collect from rcost_local into the global cost vector rcost; then rcost is
    //    complete (only) on root
    // 2. (optional; default true) Broadcast processor map of the new dm to others

    Vector<Real> rcost(rcost_local.size());
    ParallelDescriptor::GatherLayoutDataToVector<Real>(rcost_local, rcost, root);
    // rcost is now filled out on root;

    DistributionMapping r;
    if (ParallelDescriptor::MyProc() == root)
    {
        Vector<Long> cost(rcost.size());

        Real wmax = *std::max_element(rcost.begin(), rcost.end());
        Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

        for (int i = 0; i < rcost.size(); ++i) {
            cost[i] = Long(rcost[i]*scale) + 1L;
        }

        // `sort` needs to be false here since there's a parallel reduce function
        // in the processor map function, but we are executing only on root
        int nprocs = ParallelDescriptor::NProcs();
        r.SFCProcessorMap(rcost_local.boxArray(), cost, nprocs, proposedEfficiency, false);

        ComputeDistributionMappingEfficiency(rcost_local.DistributionMap(),
                                             rcost,
                                             &currentEfficiency);
    }

#ifdef BL_USE_MPI
    // Load-balanced distribution mapping is computed on root; broadcast the cost
    // to all proc (optional)
    if (broadcastToAll)
    {
        Vector<int> pmap(rcost_local.DistributionMap().size());
        if (ParallelDescriptor::MyProc() == root)
        {
            pmap = r.ProcessorMap();
        }

        // Broadcast vector from which to construct new distribution mapping
        ParallelDescriptor::Bcast(&pmap[0], pmap.size(), root);
        if (ParallelDescriptor::MyProc() != root)
        {
            r = DistributionMapping(pmap);
        }
    }
#else
    amrex::ignore_unused(broadcastToAll);
#endif

    return r;
}